

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

char * stbi__hdr_gettoken(stbi__context *z,char *buffer)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  stbi_uc sVar4;
  long lVar5;
  bool bVar6;
  
  psVar2 = z->img_buffer;
  if (z->img_buffer_end <= psVar2) {
    if (z->read_from_callbacks == 0) {
      sVar4 = '\0';
      goto LAB_00204110;
    }
    stbi__refill_buffer(z);
    psVar2 = z->img_buffer;
  }
  z->img_buffer = psVar2 + 1;
  sVar4 = *psVar2;
  psVar2 = psVar2 + 1;
LAB_00204110:
  lVar5 = 0;
  do {
    if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00204138:
      bVar6 = psVar2 < z->img_buffer_end;
    }
    else {
      iVar1 = (*(z->io).eof)(z->io_user_data);
      if (iVar1 != 0) {
        if (z->read_from_callbacks != 0) {
          psVar2 = z->img_buffer;
          goto LAB_00204138;
        }
        goto LAB_00204216;
      }
      bVar6 = true;
    }
    if ((sVar4 == '\n') || (!bVar6)) goto LAB_00204216;
    buffer[lVar5] = sVar4;
    if (lVar5 == 0x3fe) break;
    psVar2 = z->img_buffer;
    if (psVar2 < z->img_buffer_end) {
LAB_0020418b:
      z->img_buffer = psVar2 + 1;
      sVar4 = *psVar2;
      psVar2 = psVar2 + 1;
    }
    else {
      if (z->read_from_callbacks != 0) {
        stbi__refill_buffer(z);
        psVar2 = z->img_buffer;
        goto LAB_0020418b;
      }
      sVar4 = '\0';
    }
    lVar5 = lVar5 + 1;
  } while( true );
LAB_002041a8:
  if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_002041c2:
    psVar3 = z->img_buffer;
    psVar2 = z->img_buffer_end;
    if (psVar2 <= psVar3) goto LAB_00204210;
  }
  else {
    iVar1 = (*(z->io).eof)(z->io_user_data);
    if (iVar1 != 0) {
      if (z->read_from_callbacks != 0) goto LAB_002041c2;
      goto LAB_00204210;
    }
    psVar3 = z->img_buffer;
    psVar2 = z->img_buffer_end;
  }
  if (psVar2 <= psVar3) {
    if (z->read_from_callbacks == 0) goto LAB_002041a8;
    stbi__refill_buffer(z);
    psVar3 = z->img_buffer;
  }
  z->img_buffer = psVar3 + 1;
  if (*psVar3 == '\n') {
LAB_00204210:
    lVar5 = 0x3ff;
LAB_00204216:
    buffer[lVar5] = '\0';
    return buffer;
  }
  goto LAB_002041a8;
}

Assistant:

static char *stbi__hdr_gettoken(stbi__context *z, char *buffer)
{
   int len=0;
   char c = '\0';

   c = (char) stbi__get8(z);

   while (!stbi__at_eof(z) && c != '\n') {
      buffer[len++] = c;
      if (len == STBI__HDR_BUFLEN-1) {
         // flush to end of line
         while (!stbi__at_eof(z) && stbi__get8(z) != '\n')
            ;
         break;
      }
      c = (char) stbi__get8(z);
   }

   buffer[len] = 0;
   return buffer;
}